

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form1_Subtract(SubtractForm1 Subtract)

{
  bool bVar1;
  bool bVar2;
  uint8_t value;
  Image output;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  
  Unit_Test::intensityArray(&intensity,2);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformImages(&input,&intensity,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  (*Subtract)(&output,input.
                      super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
              input.
              super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1);
  bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<unsigned_char>>
                    (input.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,&output);
  bVar2 = false;
  if (bVar1) {
    value = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start -
            intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[1];
    if (*intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start <
        intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[1]) {
      value = '\0';
    }
    bVar2 = Unit_Test::verifyImage(&output,value);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar2;
}

Assistant:

bool form1_Subtract(SubtractForm1 Subtract)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const PenguinV_Image::Image output = Subtract( input[0], input[1] );

        return equalSize( input[0], output ) &&
            verifyImage( output, static_cast<uint8_t>( intensity[0] > intensity[1] ? intensity[0] - intensity[1] : 0u ) );
    }